

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::length2(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *__return_storage_ptr__,
         SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  cpp_dec_float<200U,_int,_void> *u;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  int i;
  long lVar3;
  byte bVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  bVar4 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&__return_storage_ptr__->m_backend,0,(type *)0x0);
  if (this->setupStatus == true) {
    for (lVar3 = 0; lVar3 < (this->super_IdxSet).num; lVar3 = lVar3 + 1) {
      u = &(this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_IdxSet).idx[lVar3]].m_backend;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,u,u);
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                (&__return_storage_ptr__->m_backend,&result.m_backend);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2(&result,&this->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
    pnVar1 = &result;
    pnVar2 = __return_storage_ptr__;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar2->m_backend).data._M_elems[0] = *(uint *)pnVar1;
      pnVar1 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar1 + ((ulong)bVar4 * -2 + 1) * 4);
      pnVar2 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar2 + ((ulong)bVar4 * -2 + 1) * 4);
    }
    (__return_storage_ptr__->m_backend).exp = result.m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = result.m_backend.neg;
    (__return_storage_ptr__->m_backend).fpclass = result.m_backend.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = result.m_backend.prec_elem;
  }
  return __return_storage_ptr__;
}

Assistant:

R length2() const
   {
      R x = 0;

      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            x += VectorBase<R>::val[idx[i]] * VectorBase<R>::val[idx[i]];
      }
      else
         x = VectorBase<R>::length2();

      return x;
   }